

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O2

int Gia_ManConeMark(Gia_Man_t *p,int iOut,int Limit)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *p_00;
  
  pGVar3 = Gia_ManPo(p,iOut);
  p_00 = Vec_IntAlloc(100);
  iVar1 = Gia_ObjId(p,pGVar3);
  Vec_IntPush(p_00,iVar1);
  Gia_ManIncrementTravId(p);
  Gia_ObjSetTravIdCurrent(p,p->pObjs);
  iVar1 = 0;
  do {
    if (p_00->nSize <= iVar1) break;
    iVar2 = Vec_IntEntry(p_00,iVar1);
    pGVar3 = Gia_ManObj(p,iVar2);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ManConeMark_rec(p,pGVar3,p_00,Limit);
    iVar1 = iVar1 + 1;
  } while (iVar2 == 0);
  iVar1 = p_00->nSize;
  Vec_IntFree(p_00);
  return iVar1 + -1;
}

Assistant:

int Gia_ManConeMark( Gia_Man_t * p, int iOut, int Limit )
{
    Vec_Int_t * vRoots;
    Gia_Obj_t * pObj;
    int i, RetValue;
    // start the outputs
    pObj = Gia_ManPo( p, iOut );
    vRoots = Vec_IntAlloc( 100 );
    Vec_IntPush( vRoots, Gia_ObjId(p, pObj) );
    // mark internal nodes
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    Gia_ManForEachObjVec( vRoots, p, pObj, i )
        if ( Gia_ManConeMark_rec( p, pObj, vRoots, Limit ) )
            break;
    RetValue = Vec_IntSize( vRoots ) - 1;
    Vec_IntFree( vRoots );
    return RetValue;
}